

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O0

bool YAML::Utils::WriteTag(ostream_wrapper *out,string *str,bool verbatim)

{
  bool bVar1;
  char *pcVar2;
  RegEx *this;
  size_t size;
  RegEx *source;
  byte in_DL;
  ostream_wrapper *in_RDI;
  int n;
  RegEx *reValid;
  StringCharSource buffer;
  undefined7 in_stack_ffffffffffffff48;
  char in_stack_ffffffffffffff4f;
  ostream_wrapper *in_stack_ffffffffffffff50;
  int local_7c;
  StringCharSource local_70;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  ostream_wrapper *local_10;
  
  local_19 = in_DL & 1;
  pcVar2 = "!";
  if (local_19 != 0) {
    pcVar2 = "!<";
  }
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar2,&local_41);
  YAML::operator<<(in_stack_ffffffffffffff50,
                   (string *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  this = (RegEx *)std::__cxx11::string::c_str();
  size = std::__cxx11::string::size();
  StringCharSource::StringCharSource(&local_70,(char *)this,size);
  if ((local_19 & 1) == 0) {
    source = Exp::Tag();
  }
  else {
    source = Exp::URI();
  }
  while( true ) {
    bVar1 = StringCharSource::operator_cast_to_bool(&local_70);
    if (!bVar1) {
      if ((local_19 & 1) != 0) {
        YAML::operator<<(in_stack_ffffffffffffff50,
                         (char (*) [2])CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48)
                        );
      }
      return true;
    }
    local_7c = RegEx::Match<YAML::StringCharSource>(this,(StringCharSource *)source);
    if (local_7c < 1) break;
    while (local_7c = local_7c + -1, -1 < local_7c) {
      in_stack_ffffffffffffff50 = local_10;
      StringCharSource::operator[](&local_70,0);
      YAML::operator<<(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
      StringCharSource::operator++(&local_70);
    }
  }
  return false;
}

Assistant:

bool WriteTag(ostream_wrapper& out, const std::string& str, bool verbatim) {
  out << (verbatim ? "!<" : "!");
  StringCharSource buffer(str.c_str(), str.size());
  const RegEx& reValid = verbatim ? Exp::URI() : Exp::Tag();
  while (buffer) {
    int n = reValid.Match(buffer);
    if (n <= 0) {
      return false;
    }

    while (--n >= 0) {
      out << buffer[0];
      ++buffer;
    }
  }
  if (verbatim) {
    out << ">";
  }
  return true;
}